

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 (*pauVar32) [16];
  byte bVar33;
  int iVar34;
  uint uVar35;
  ulong uVar36;
  long lVar37;
  uint uVar38;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  undefined1 (*pauVar45) [16];
  ulong uVar46;
  vint4 bi_1;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  vint4 bi;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  vint4 ai;
  undefined1 auVar62 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  float fVar74;
  undefined1 auVar75 [32];
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar76 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  uint uVar83;
  uint uVar84;
  undefined1 auVar82 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined4 uVar93;
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCFilterFunctionNArguments local_1470;
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  ulong uVar39;
  undefined1 auVar60 [32];
  undefined1 auVar66 [32];
  
  pauVar45 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1370._4_4_ = fVar2;
  local_1370._0_4_ = fVar2;
  local_1370._8_4_ = fVar2;
  local_1370._12_4_ = fVar2;
  auVar73 = ZEXT1664(local_1370);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1380._4_4_ = fVar3;
  local_1380._0_4_ = fVar3;
  local_1380._8_4_ = fVar3;
  local_1380._12_4_ = fVar3;
  auVar76 = ZEXT1664(local_1380);
  fVar74 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1390._4_4_ = fVar74;
  local_1390._0_4_ = fVar74;
  local_1390._8_4_ = fVar74;
  local_1390._12_4_ = fVar74;
  auVar82 = ZEXT1664(local_1390);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar74 = fVar74 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar34 = (tray->tfar).field_0.i[k];
  auVar50 = ZEXT1664(CONCAT412(iVar34,CONCAT48(iVar34,CONCAT44(iVar34,iVar34))));
  local_13a0._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_13a0._8_4_ = -fVar2;
  local_13a0._12_4_ = -fVar2;
  auVar87 = ZEXT1664(local_13a0);
  local_13b0._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  local_13b0._8_4_ = -fVar3;
  local_13b0._12_4_ = -fVar3;
  auVar89 = ZEXT1664(local_13b0);
  local_13c0._0_8_ = CONCAT44(fVar74,fVar74) ^ 0x8000000080000000;
  local_13c0._8_4_ = -fVar74;
  local_13c0._12_4_ = -fVar74;
  auVar92 = ZEXT1664(local_13c0);
  iVar34 = (tray->tnear).field_0.i[k];
  local_13d0._4_4_ = iVar34;
  local_13d0._0_4_ = iVar34;
  local_13d0._8_4_ = iVar34;
  local_13d0._12_4_ = iVar34;
  auVar95 = ZEXT1664(local_13d0);
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  iVar34 = 1 << ((uint)k & 0x1f);
  auVar72._4_4_ = iVar34;
  auVar72._0_4_ = iVar34;
  auVar72._8_4_ = iVar34;
  auVar72._12_4_ = iVar34;
  auVar72._16_4_ = iVar34;
  auVar72._20_4_ = iVar34;
  auVar72._24_4_ = iVar34;
  auVar72._28_4_ = iVar34;
  auVar52 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar72 = vpand_avx2(auVar72,auVar52);
  local_1140 = vpcmpeqd_avx2(auVar72,auVar52);
  auVar57._8_4_ = 0x3f800000;
  auVar57._0_8_ = 0x3f8000003f800000;
  auVar57._12_4_ = 0x3f800000;
  auVar57._16_4_ = 0x3f800000;
  auVar57._20_4_ = 0x3f800000;
  auVar57._24_4_ = 0x3f800000;
  auVar57._28_4_ = 0x3f800000;
  auVar52._8_4_ = 0xbf800000;
  auVar52._0_8_ = 0xbf800000bf800000;
  auVar52._12_4_ = 0xbf800000;
  auVar52._16_4_ = 0xbf800000;
  auVar52._20_4_ = 0xbf800000;
  auVar52._24_4_ = 0xbf800000;
  auVar52._28_4_ = 0xbf800000;
  local_1120 = vblendvps_avx(auVar57,auVar52,local_1100);
LAB_015fdf78:
  do {
    do {
      if (pauVar45 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar32 = pauVar45 + -1;
      pauVar45 = pauVar45 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar32 + 8));
    uVar36 = *(ulong *)*pauVar45;
    while ((uVar36 & 8) == 0) {
      auVar51 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar36 + 0x20 + uVar44),auVar87._0_16_,
                                auVar73._0_16_);
      auVar55 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar36 + 0x20 + uVar42),auVar89._0_16_,
                                auVar76._0_16_);
      auVar51 = vpmaxsd_avx(auVar51,auVar55);
      auVar55 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar36 + 0x20 + uVar41),auVar92._0_16_,
                                auVar82._0_16_);
      auVar55 = vpmaxsd_avx(auVar55,auVar95._0_16_);
      auVar55 = vpmaxsd_avx(auVar51,auVar55);
      auVar51 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar36 + 0x20 + (uVar44 ^ 0x10)),
                                auVar87._0_16_,auVar73._0_16_);
      auVar61 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar36 + 0x20 + (uVar42 ^ 0x10)),
                                auVar89._0_16_,auVar76._0_16_);
      auVar51 = vpminsd_avx(auVar51,auVar61);
      auVar61 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar36 + 0x20 + (uVar41 ^ 0x10)),
                                auVar92._0_16_,auVar82._0_16_);
      auVar61 = vpminsd_avx(auVar61,auVar50._0_16_);
      auVar51 = vpminsd_avx(auVar51,auVar61);
      auVar51 = vpcmpgtd_avx(auVar55,auVar51);
      iVar34 = vmovmskps_avx(auVar51);
      local_1340._0_16_ = auVar55;
      if (iVar34 == 0xf) goto LAB_015fdf78;
      bVar33 = (byte)iVar34 ^ 0xf;
      uVar46 = uVar36 & 0xfffffffffffffff0;
      lVar43 = 0;
      for (uVar36 = (ulong)bVar33; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
        lVar43 = lVar43 + 1;
      }
      uVar36 = *(ulong *)(uVar46 + lVar43 * 8);
      uVar38 = bVar33 - 1 & (uint)bVar33;
      uVar39 = (ulong)uVar38;
      if (uVar38 != 0) {
        uVar35 = *(uint *)(local_1340 + lVar43 * 4);
        lVar43 = 0;
        for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
          lVar43 = lVar43 + 1;
        }
        uVar38 = uVar38 - 1 & uVar38;
        uVar40 = (ulong)uVar38;
        uVar39 = *(ulong *)(uVar46 + lVar43 * 8);
        uVar83 = *(uint *)(local_1340 + lVar43 * 4);
        if (uVar38 == 0) {
          if (uVar35 < uVar83) {
            *(ulong *)*pauVar45 = uVar39;
            *(uint *)(*pauVar45 + 8) = uVar83;
            pauVar45 = pauVar45 + 1;
          }
          else {
            *(ulong *)*pauVar45 = uVar36;
            *(uint *)(*pauVar45 + 8) = uVar35;
            pauVar45 = pauVar45 + 1;
            uVar36 = uVar39;
          }
        }
        else {
          auVar51._8_8_ = 0;
          auVar51._0_8_ = uVar36;
          auVar51 = vpunpcklqdq_avx(auVar51,ZEXT416(uVar35));
          auVar55._8_8_ = 0;
          auVar55._0_8_ = uVar39;
          auVar55 = vpunpcklqdq_avx(auVar55,ZEXT416(uVar83));
          lVar43 = 0;
          for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
            lVar43 = lVar43 + 1;
          }
          uVar38 = uVar38 - 1 & uVar38;
          uVar36 = (ulong)uVar38;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = *(ulong *)(uVar46 + lVar43 * 8);
          auVar56 = vpunpcklqdq_avx(auVar61,ZEXT416(*(uint *)(local_1340 + lVar43 * 4)));
          auVar61 = vpcmpgtd_avx(auVar55,auVar51);
          if (uVar38 == 0) {
            auVar68 = vpshufd_avx(auVar61,0xaa);
            auVar61 = vblendvps_avx(auVar55,auVar51,auVar68);
            auVar51 = vblendvps_avx(auVar51,auVar55,auVar68);
            auVar55 = vpcmpgtd_avx(auVar56,auVar61);
            auVar68 = vpshufd_avx(auVar55,0xaa);
            auVar55 = vblendvps_avx(auVar56,auVar61,auVar68);
            auVar61 = vblendvps_avx(auVar61,auVar56,auVar68);
            auVar56 = vpcmpgtd_avx(auVar61,auVar51);
            auVar68 = vpshufd_avx(auVar56,0xaa);
            auVar56 = vblendvps_avx(auVar61,auVar51,auVar68);
            auVar51 = vblendvps_avx(auVar51,auVar61,auVar68);
            *pauVar45 = auVar51;
            pauVar45[1] = auVar56;
            uVar36 = auVar55._0_8_;
            pauVar45 = pauVar45 + 2;
          }
          else {
            lVar43 = 0;
            for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
              lVar43 = lVar43 + 1;
            }
            auVar68._8_8_ = 0;
            auVar68._0_8_ = *(ulong *)(uVar46 + lVar43 * 8);
            auVar62 = vpunpcklqdq_avx(auVar68,ZEXT416(*(uint *)(local_1340 + lVar43 * 4)));
            auVar68 = vpshufd_avx(auVar61,0xaa);
            auVar61 = vblendvps_avx(auVar55,auVar51,auVar68);
            auVar51 = vblendvps_avx(auVar51,auVar55,auVar68);
            auVar55 = vpcmpgtd_avx(auVar62,auVar56);
            auVar68 = vpshufd_avx(auVar55,0xaa);
            auVar55 = vblendvps_avx(auVar62,auVar56,auVar68);
            auVar56 = vblendvps_avx(auVar56,auVar62,auVar68);
            auVar68 = vpcmpgtd_avx(auVar56,auVar51);
            auVar62 = vpshufd_avx(auVar68,0xaa);
            auVar68 = vblendvps_avx(auVar56,auVar51,auVar62);
            auVar51 = vblendvps_avx(auVar51,auVar56,auVar62);
            auVar56 = vpcmpgtd_avx(auVar55,auVar61);
            auVar62 = vpshufd_avx(auVar56,0xaa);
            auVar56 = vblendvps_avx(auVar55,auVar61,auVar62);
            auVar55 = vblendvps_avx(auVar61,auVar55,auVar62);
            auVar61 = vpcmpgtd_avx(auVar68,auVar55);
            auVar62 = vpshufd_avx(auVar61,0xaa);
            auVar61 = vblendvps_avx(auVar68,auVar55,auVar62);
            auVar55 = vblendvps_avx(auVar55,auVar68,auVar62);
            *pauVar45 = auVar51;
            pauVar45[1] = auVar55;
            pauVar45[2] = auVar61;
            uVar36 = auVar56._0_8_;
            pauVar45 = pauVar45 + 3;
          }
        }
      }
    }
    uVar46 = uVar36 & 0xfffffffffffffff0;
    for (lVar43 = 0; lVar43 != (ulong)((uint)uVar36 & 0xf) - 8; lVar43 = lVar43 + 1) {
      lVar37 = lVar43 * 0x60;
      pSVar5 = context->scene;
      ppfVar6 = (pSVar5->vertices).items;
      pfVar7 = ppfVar6[*(uint *)(uVar46 + 0x48 + lVar37)];
      auVar58._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar46 + 0x28 + lVar37));
      auVar58._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar46 + 8 + lVar37));
      pfVar8 = ppfVar6[*(uint *)(uVar46 + 0x40 + lVar37)];
      auVar63._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar46 + 0x20 + lVar37));
      auVar63._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar46 + lVar37));
      pfVar9 = ppfVar6[*(uint *)(uVar46 + 0x44 + lVar37)];
      auVar69._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar46 + 0x24 + lVar37));
      auVar69._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar46 + 4 + lVar37));
      pfVar10 = ppfVar6[*(uint *)(uVar46 + 0x4c + lVar37)];
      auVar80._16_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar46 + 0x2c + lVar37));
      auVar80._0_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar46 + 0xc + lVar37));
      lVar1 = uVar46 + 0x40 + lVar37;
      local_10e0 = *(undefined8 *)(lVar1 + 0x10);
      uStack_10d8 = *(undefined8 *)(lVar1 + 0x18);
      uStack_10d0 = local_10e0;
      uStack_10c8 = uStack_10d8;
      lVar1 = uVar46 + 0x50 + lVar37;
      local_1360 = *(undefined8 *)(lVar1 + 0x10);
      uStack_1358 = *(undefined8 *)(lVar1 + 0x18);
      auVar61 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar46 + 0x10 + lVar37)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar46 + 0x18 + lVar37)));
      auVar51 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar46 + 0x10 + lVar37)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar46 + 0x18 + lVar37)));
      auVar56 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar46 + 0x14 + lVar37)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar46 + 0x1c + lVar37)));
      auVar55 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar46 + 0x14 + lVar37)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar46 + 0x1c + lVar37)));
      auVar68 = vunpcklps_avx(auVar51,auVar55);
      auVar62 = vunpcklps_avx(auVar61,auVar56);
      auVar51 = vunpckhps_avx(auVar61,auVar56);
      auVar56 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar46 + 0x30 + lVar37)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar46 + 0x38 + lVar37)));
      auVar55 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar46 + 0x30 + lVar37)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar46 + 0x38 + lVar37)));
      auVar21 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar46 + 0x34 + lVar37)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar46 + 0x3c + lVar37)));
      auVar61 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar46 + 0x34 + lVar37)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar46 + 0x3c + lVar37)));
      auVar61 = vunpcklps_avx(auVar55,auVar61);
      auVar22 = vunpcklps_avx(auVar56,auVar21);
      auVar55 = vunpckhps_avx(auVar56,auVar21);
      uStack_1350 = local_1360;
      uStack_1348 = uStack_1358;
      auVar72 = vunpcklps_avx(auVar69,auVar80);
      auVar52 = vunpcklps_avx(auVar63,auVar58);
      auVar23 = vunpcklps_avx(auVar52,auVar72);
      auVar67 = vunpckhps_avx(auVar52,auVar72);
      auVar72 = vunpckhps_avx(auVar69,auVar80);
      auVar52 = vunpckhps_avx(auVar63,auVar58);
      auVar24 = vunpcklps_avx(auVar52,auVar72);
      auVar59._16_16_ = auVar62;
      auVar59._0_16_ = auVar62;
      auVar64._16_16_ = auVar51;
      auVar64._0_16_ = auVar51;
      auVar53._16_16_ = auVar68;
      auVar53._0_16_ = auVar68;
      auVar70._16_16_ = auVar22;
      auVar70._0_16_ = auVar22;
      auVar85._16_16_ = auVar55;
      auVar85._0_16_ = auVar55;
      auVar47._16_16_ = auVar61;
      auVar47._0_16_ = auVar61;
      auVar52 = vsubps_avx(auVar23,auVar59);
      auVar72 = vsubps_avx(auVar67,auVar64);
      auVar57 = vsubps_avx(auVar24,auVar53);
      auVar53 = vsubps_avx(auVar70,auVar23);
      auVar18 = vsubps_avx(auVar85,auVar67);
      auVar19 = vsubps_avx(auVar47,auVar24);
      auVar20._4_4_ = auVar72._4_4_ * auVar19._4_4_;
      auVar20._0_4_ = auVar72._0_4_ * auVar19._0_4_;
      auVar20._8_4_ = auVar72._8_4_ * auVar19._8_4_;
      auVar20._12_4_ = auVar72._12_4_ * auVar19._12_4_;
      auVar20._16_4_ = auVar72._16_4_ * auVar19._16_4_;
      auVar20._20_4_ = auVar72._20_4_ * auVar19._20_4_;
      auVar20._24_4_ = auVar72._24_4_ * auVar19._24_4_;
      auVar20._28_4_ = auVar61._12_4_;
      auVar56 = vfmsub231ps_fma(auVar20,auVar18,auVar57);
      auVar25._4_4_ = auVar57._4_4_ * auVar53._4_4_;
      auVar25._0_4_ = auVar57._0_4_ * auVar53._0_4_;
      auVar25._8_4_ = auVar57._8_4_ * auVar53._8_4_;
      auVar25._12_4_ = auVar57._12_4_ * auVar53._12_4_;
      auVar25._16_4_ = auVar57._16_4_ * auVar53._16_4_;
      auVar25._20_4_ = auVar57._20_4_ * auVar53._20_4_;
      auVar25._24_4_ = auVar57._24_4_ * auVar53._24_4_;
      auVar25._28_4_ = auVar68._12_4_;
      auVar68 = vfmsub231ps_fma(auVar25,auVar19,auVar52);
      uVar93 = *(undefined4 *)(ray + k * 4);
      auVar65._4_4_ = uVar93;
      auVar65._0_4_ = uVar93;
      auVar65._8_4_ = uVar93;
      auVar65._12_4_ = uVar93;
      auVar65._16_4_ = uVar93;
      auVar65._20_4_ = uVar93;
      auVar65._24_4_ = uVar93;
      auVar65._28_4_ = uVar93;
      uVar93 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar96._4_4_ = uVar93;
      auVar96._0_4_ = uVar93;
      auVar96._8_4_ = uVar93;
      auVar96._12_4_ = uVar93;
      auVar96._16_4_ = uVar93;
      auVar96._20_4_ = uVar93;
      auVar96._24_4_ = uVar93;
      auVar96._28_4_ = uVar93;
      uVar93 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar98._4_4_ = uVar93;
      auVar98._0_4_ = uVar93;
      auVar98._8_4_ = uVar93;
      auVar98._12_4_ = uVar93;
      auVar98._16_4_ = uVar93;
      auVar98._20_4_ = uVar93;
      auVar98._24_4_ = uVar93;
      auVar98._28_4_ = uVar93;
      fVar2 = *(float *)(ray + k * 4 + 0x80);
      auVar86._4_4_ = fVar2;
      auVar86._0_4_ = fVar2;
      auVar86._8_4_ = fVar2;
      auVar86._12_4_ = fVar2;
      auVar86._16_4_ = fVar2;
      auVar86._20_4_ = fVar2;
      auVar86._24_4_ = fVar2;
      auVar86._28_4_ = fVar2;
      auVar23 = vsubps_avx(auVar23,auVar65);
      fVar3 = *(float *)(ray + k * 4 + 0xa0);
      auVar90._4_4_ = fVar3;
      auVar90._0_4_ = fVar3;
      auVar90._8_4_ = fVar3;
      auVar90._12_4_ = fVar3;
      auVar90._16_4_ = fVar3;
      auVar90._20_4_ = fVar3;
      auVar90._24_4_ = fVar3;
      auVar90._28_4_ = fVar3;
      auVar67 = vsubps_avx(auVar67,auVar96);
      fVar74 = *(float *)(ray + k * 4 + 0xc0);
      auVar97._4_4_ = fVar74;
      auVar97._0_4_ = fVar74;
      auVar97._8_4_ = fVar74;
      auVar97._12_4_ = fVar74;
      auVar97._16_4_ = fVar74;
      auVar97._20_4_ = fVar74;
      auVar97._24_4_ = fVar74;
      auVar97._28_4_ = fVar74;
      auVar20 = vsubps_avx(auVar24,auVar98);
      auVar26._4_4_ = fVar2 * auVar67._4_4_;
      auVar26._0_4_ = fVar2 * auVar67._0_4_;
      auVar26._8_4_ = fVar2 * auVar67._8_4_;
      auVar26._12_4_ = fVar2 * auVar67._12_4_;
      auVar26._16_4_ = fVar2 * auVar67._16_4_;
      auVar26._20_4_ = fVar2 * auVar67._20_4_;
      auVar26._24_4_ = fVar2 * auVar67._24_4_;
      auVar26._28_4_ = auVar24._28_4_;
      auVar51 = vfmsub231ps_fma(auVar26,auVar23,auVar90);
      auVar24._4_4_ = auVar19._4_4_ * auVar51._4_4_;
      auVar24._0_4_ = auVar19._0_4_ * auVar51._0_4_;
      auVar24._8_4_ = auVar19._8_4_ * auVar51._8_4_;
      auVar24._12_4_ = auVar19._12_4_ * auVar51._12_4_;
      auVar24._16_4_ = auVar19._16_4_ * 0.0;
      auVar24._20_4_ = auVar19._20_4_ * 0.0;
      auVar24._24_4_ = auVar19._24_4_ * 0.0;
      auVar24._28_4_ = auVar19._28_4_;
      auVar94._0_4_ = auVar57._0_4_ * auVar51._0_4_;
      auVar94._4_4_ = auVar57._4_4_ * auVar51._4_4_;
      auVar94._8_4_ = auVar57._8_4_ * auVar51._8_4_;
      auVar94._12_4_ = auVar57._12_4_ * auVar51._12_4_;
      auVar94._16_4_ = auVar57._16_4_ * 0.0;
      auVar94._20_4_ = auVar57._20_4_ * 0.0;
      auVar94._24_4_ = auVar57._24_4_ * 0.0;
      auVar94._28_4_ = 0;
      auVar19._4_4_ = fVar74 * auVar23._4_4_;
      auVar19._0_4_ = fVar74 * auVar23._0_4_;
      auVar19._8_4_ = fVar74 * auVar23._8_4_;
      auVar19._12_4_ = fVar74 * auVar23._12_4_;
      auVar19._16_4_ = fVar74 * auVar23._16_4_;
      auVar19._20_4_ = fVar74 * auVar23._20_4_;
      auVar19._24_4_ = fVar74 * auVar23._24_4_;
      auVar19._28_4_ = auVar57._28_4_;
      auVar55 = vfmsub231ps_fma(auVar19,auVar20,auVar86);
      auVar51 = vfmadd231ps_fma(auVar24,ZEXT1632(auVar55),auVar18);
      auVar55 = vfmadd231ps_fma(auVar94,auVar72,ZEXT1632(auVar55));
      auVar27._4_4_ = auVar52._4_4_ * auVar18._4_4_;
      auVar27._0_4_ = auVar52._0_4_ * auVar18._0_4_;
      auVar27._8_4_ = auVar52._8_4_ * auVar18._8_4_;
      auVar27._12_4_ = auVar52._12_4_ * auVar18._12_4_;
      auVar27._16_4_ = auVar52._16_4_ * auVar18._16_4_;
      auVar27._20_4_ = auVar52._20_4_ * auVar18._20_4_;
      auVar27._24_4_ = auVar52._24_4_ * auVar18._24_4_;
      auVar27._28_4_ = auVar18._28_4_;
      auVar62 = vfmsub231ps_fma(auVar27,auVar53,auVar72);
      auVar18._4_4_ = fVar3 * auVar20._4_4_;
      auVar18._0_4_ = fVar3 * auVar20._0_4_;
      auVar18._8_4_ = fVar3 * auVar20._8_4_;
      auVar18._12_4_ = fVar3 * auVar20._12_4_;
      auVar18._16_4_ = fVar3 * auVar20._16_4_;
      auVar18._20_4_ = fVar3 * auVar20._20_4_;
      auVar18._24_4_ = fVar3 * auVar20._24_4_;
      auVar18._28_4_ = auVar72._28_4_;
      auVar21 = vfmsub231ps_fma(auVar18,auVar67,auVar97);
      fVar2 = auVar62._0_4_;
      fVar3 = auVar62._4_4_;
      auVar28._4_4_ = fVar74 * fVar3;
      auVar28._0_4_ = fVar74 * fVar2;
      fVar13 = auVar62._8_4_;
      auVar28._8_4_ = fVar74 * fVar13;
      fVar14 = auVar62._12_4_;
      auVar28._12_4_ = fVar74 * fVar14;
      auVar28._16_4_ = fVar74 * 0.0;
      auVar28._20_4_ = fVar74 * 0.0;
      auVar28._24_4_ = fVar74 * 0.0;
      auVar28._28_4_ = fVar74;
      auVar61 = vfmadd231ps_fma(auVar28,ZEXT1632(auVar68),auVar90);
      auVar61 = vfmadd231ps_fma(ZEXT1632(auVar61),ZEXT1632(auVar56),auVar86);
      auVar81._8_4_ = 0x80000000;
      auVar81._0_8_ = 0x8000000080000000;
      auVar81._12_4_ = 0x80000000;
      auVar81._16_4_ = 0x80000000;
      auVar81._20_4_ = 0x80000000;
      auVar81._24_4_ = 0x80000000;
      auVar81._28_4_ = 0x80000000;
      auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),ZEXT1632(auVar21),auVar53);
      auVar72 = vandps_avx(ZEXT1632(auVar61),auVar81);
      uVar38 = auVar72._0_4_;
      auVar71._0_4_ = (float)(uVar38 ^ auVar51._0_4_);
      uVar35 = auVar72._4_4_;
      auVar71._4_4_ = (float)(uVar35 ^ auVar51._4_4_);
      uVar83 = auVar72._8_4_;
      auVar71._8_4_ = (float)(uVar83 ^ auVar51._8_4_);
      uVar84 = auVar72._12_4_;
      auVar71._12_4_ = (float)(uVar84 ^ auVar51._12_4_);
      local_1300._16_4_ = auVar72._16_4_;
      auVar71._16_4_ = local_1300._16_4_;
      local_1300._20_4_ = auVar72._20_4_;
      auVar71._20_4_ = local_1300._20_4_;
      local_1300._24_4_ = auVar72._24_4_;
      auVar71._24_4_ = local_1300._24_4_;
      local_1300._28_4_ = auVar72._28_4_;
      auVar71._28_4_ = local_1300._28_4_;
      auVar51 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar52,ZEXT1632(auVar21));
      local_1320._0_4_ = (float)(uVar38 ^ auVar51._0_4_);
      local_1320._4_4_ = (float)(uVar35 ^ auVar51._4_4_);
      local_1320._8_4_ = (float)(uVar83 ^ auVar51._8_4_);
      local_1320._12_4_ = (float)(uVar84 ^ auVar51._12_4_);
      local_1320._16_4_ = local_1300._16_4_;
      local_1320._20_4_ = local_1300._20_4_;
      local_1320._24_4_ = local_1300._24_4_;
      local_1320._28_4_ = local_1300._28_4_;
      auVar72 = vcmpps_avx(auVar71,ZEXT832(0) << 0x20,5);
      auVar52 = vcmpps_avx(local_1320,ZEXT832(0) << 0x20,5);
      auVar72 = vandps_avx(auVar72,auVar52);
      auVar75._8_4_ = 0x7fffffff;
      auVar75._0_8_ = 0x7fffffff7fffffff;
      auVar75._12_4_ = 0x7fffffff;
      auVar75._16_4_ = 0x7fffffff;
      auVar75._20_4_ = 0x7fffffff;
      auVar75._24_4_ = 0x7fffffff;
      auVar75._28_4_ = 0x7fffffff;
      local_12e0 = vandps_avx(ZEXT1632(auVar61),auVar75);
      auVar52 = vcmpps_avx(ZEXT1632(auVar61),ZEXT832(0) << 0x20,4);
      auVar72 = vandps_avx(auVar72,auVar52);
      auVar88._0_4_ = auVar71._0_4_ + local_1320._0_4_;
      auVar88._4_4_ = auVar71._4_4_ + local_1320._4_4_;
      auVar88._8_4_ = auVar71._8_4_ + local_1320._8_4_;
      auVar88._12_4_ = auVar71._12_4_ + local_1320._12_4_;
      auVar88._16_4_ = local_1300._16_4_ + local_1300._16_4_;
      auVar88._20_4_ = local_1300._20_4_ + local_1300._20_4_;
      auVar88._24_4_ = local_1300._24_4_ + local_1300._24_4_;
      auVar88._28_4_ = local_1300._28_4_ + local_1300._28_4_;
      auVar52 = vcmpps_avx(auVar88,local_12e0,2);
      auVar57 = auVar52 & auVar72;
      if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar57 >> 0x7f,0) != '\0') ||
            (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar57 >> 0xbf,0) != '\0') ||
          (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar57[0x1f] < '\0') {
        auVar72 = vandps_avx(auVar72,auVar52);
        auVar51 = vpackssdw_avx(auVar72._0_16_,auVar72._16_16_);
        auVar29._4_4_ = fVar3 * auVar20._4_4_;
        auVar29._0_4_ = fVar2 * auVar20._0_4_;
        auVar29._8_4_ = fVar13 * auVar20._8_4_;
        auVar29._12_4_ = fVar14 * auVar20._12_4_;
        auVar29._16_4_ = auVar20._16_4_ * 0.0;
        auVar29._20_4_ = auVar20._20_4_ * 0.0;
        auVar29._24_4_ = auVar20._24_4_ * 0.0;
        auVar29._28_4_ = auVar20._28_4_;
        auVar55 = vfmadd213ps_fma(auVar67,ZEXT1632(auVar68),auVar29);
        auVar55 = vfmadd213ps_fma(auVar23,ZEXT1632(auVar56),ZEXT1632(auVar55));
        local_1300._0_4_ = (float)(uVar38 ^ auVar55._0_4_);
        local_1300._4_4_ = (float)(uVar35 ^ auVar55._4_4_);
        local_1300._8_4_ = (float)(uVar83 ^ auVar55._8_4_);
        local_1300._12_4_ = (float)(uVar84 ^ auVar55._12_4_);
        fVar74 = *(float *)(ray + k * 4 + 0x60);
        auVar23._4_4_ = local_12e0._4_4_ * fVar74;
        auVar23._0_4_ = local_12e0._0_4_ * fVar74;
        auVar23._8_4_ = local_12e0._8_4_ * fVar74;
        auVar23._12_4_ = local_12e0._12_4_ * fVar74;
        auVar23._16_4_ = local_12e0._16_4_ * fVar74;
        auVar23._20_4_ = local_12e0._20_4_ * fVar74;
        auVar23._24_4_ = local_12e0._24_4_ * fVar74;
        auVar23._28_4_ = fVar74;
        auVar72 = vcmpps_avx(auVar23,local_1300,1);
        fVar74 = *(float *)(ray + k * 4 + 0x100);
        auVar50 = ZEXT3264(CONCAT428(fVar74,CONCAT424(fVar74,CONCAT420(fVar74,CONCAT416(fVar74,
                                                  CONCAT412(fVar74,CONCAT48(fVar74,CONCAT44(fVar74,
                                                  fVar74))))))));
        auVar67._0_4_ = local_12e0._0_4_ * fVar74;
        auVar67._4_4_ = local_12e0._4_4_ * fVar74;
        auVar67._8_4_ = local_12e0._8_4_ * fVar74;
        auVar67._12_4_ = local_12e0._12_4_ * fVar74;
        auVar67._16_4_ = local_12e0._16_4_ * fVar74;
        auVar67._20_4_ = local_12e0._20_4_ * fVar74;
        auVar67._24_4_ = local_12e0._24_4_ * fVar74;
        auVar67._28_4_ = 0;
        auVar52 = vcmpps_avx(local_1300,auVar67,2);
        auVar72 = vandps_avx(auVar72,auVar52);
        auVar55 = vpackssdw_avx(auVar72._0_16_,auVar72._16_16_);
        auVar51 = vpand_avx(auVar51,auVar55);
        auVar72 = vpmovzxwd_avx2(auVar51);
        auVar72 = vpslld_avx2(auVar72,0x1f);
        if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar72 >> 0x7f,0) != '\0') ||
              (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar72 >> 0xbf,0) != '\0') ||
            (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar72[0x1f] < '\0') {
          local_1440 = vpsrad_avx2(auVar72,0x1f);
          local_1340 = auVar71;
          local_12c0 = ZEXT1632(auVar56);
          local_12a0 = ZEXT1632(auVar68);
          local_1280 = ZEXT1632(auVar62);
          local_1260 = local_1440;
          local_1180 = local_1100;
          auVar52 = vrcpps_avx(local_12e0);
          auVar91._8_4_ = 0x3f800000;
          auVar91._0_8_ = 0x3f8000003f800000;
          auVar91._12_4_ = 0x3f800000;
          auVar91._16_4_ = 0x3f800000;
          auVar91._20_4_ = 0x3f800000;
          auVar91._24_4_ = 0x3f800000;
          auVar91._28_4_ = 0x3f800000;
          auVar55 = vfnmadd213ps_fma(local_12e0,auVar52,auVar91);
          auVar55 = vfmadd132ps_fma(ZEXT1632(auVar55),auVar52,auVar52);
          fVar74 = auVar55._0_4_;
          fVar77 = auVar55._4_4_;
          local_1200._4_4_ = fVar77 * local_1300._4_4_;
          local_1200._0_4_ = fVar74 * local_1300._0_4_;
          fVar78 = auVar55._8_4_;
          local_1200._8_4_ = fVar78 * local_1300._8_4_;
          fVar79 = auVar55._12_4_;
          local_1200._12_4_ = fVar79 * local_1300._12_4_;
          local_1200._16_4_ = local_1300._16_4_ * 0.0;
          local_1200._20_4_ = local_1300._20_4_ * 0.0;
          local_1200._24_4_ = local_1300._24_4_ * 0.0;
          local_1200._28_4_ = auVar52._28_4_;
          auVar73 = ZEXT3264(local_1200);
          auVar30._4_4_ = fVar77 * auVar71._4_4_;
          auVar30._0_4_ = fVar74 * auVar71._0_4_;
          auVar30._8_4_ = fVar78 * auVar71._8_4_;
          auVar30._12_4_ = fVar79 * auVar71._12_4_;
          auVar30._16_4_ = local_1300._16_4_ * 0.0;
          auVar30._20_4_ = local_1300._20_4_ * 0.0;
          auVar30._24_4_ = local_1300._24_4_ * 0.0;
          auVar30._28_4_ = local_1300._28_4_;
          auVar52 = vminps_avx(auVar30,auVar91);
          auVar31._4_4_ = fVar77 * local_1320._4_4_;
          auVar31._0_4_ = fVar74 * local_1320._0_4_;
          auVar31._8_4_ = fVar78 * local_1320._8_4_;
          auVar31._12_4_ = fVar79 * local_1320._12_4_;
          auVar31._16_4_ = local_1300._16_4_ * 0.0;
          auVar31._20_4_ = local_1300._20_4_ * 0.0;
          auVar31._24_4_ = local_1300._24_4_ * 0.0;
          auVar31._28_4_ = local_1300._28_4_;
          auVar57 = vminps_avx(auVar31,auVar91);
          auVar53 = vsubps_avx(auVar91,auVar52);
          auVar18 = vsubps_avx(auVar91,auVar57);
          local_1220 = vblendvps_avx(auVar57,auVar53,local_1100);
          local_1240 = vblendvps_avx(auVar52,auVar18,local_1100);
          fVar74 = local_1120._0_4_;
          local_11e0._0_4_ = auVar56._0_4_ * fVar74;
          fVar77 = local_1120._4_4_;
          local_11e0._4_4_ = auVar56._4_4_ * fVar77;
          fVar78 = local_1120._8_4_;
          local_11e0._8_4_ = auVar56._8_4_ * fVar78;
          fVar79 = local_1120._12_4_;
          local_11e0._12_4_ = auVar56._12_4_ * fVar79;
          fVar15 = local_1120._16_4_;
          local_11e0._16_4_ = fVar15 * 0.0;
          fVar16 = local_1120._20_4_;
          local_11e0._20_4_ = fVar16 * 0.0;
          fVar17 = local_1120._24_4_;
          local_11e0._24_4_ = fVar17 * 0.0;
          local_11e0._28_4_ = 0;
          local_11c0._0_4_ = fVar74 * auVar68._0_4_;
          local_11c0._4_4_ = fVar77 * auVar68._4_4_;
          local_11c0._8_4_ = fVar78 * auVar68._8_4_;
          local_11c0._12_4_ = fVar79 * auVar68._12_4_;
          local_11c0._16_4_ = fVar15 * 0.0;
          local_11c0._20_4_ = fVar16 * 0.0;
          local_11c0._24_4_ = fVar17 * 0.0;
          local_11c0._28_4_ = 0;
          local_11a0._0_4_ = fVar74 * fVar2;
          local_11a0._4_4_ = fVar77 * fVar3;
          local_11a0._8_4_ = fVar78 * fVar13;
          local_11a0._12_4_ = fVar79 * fVar14;
          local_11a0._16_4_ = fVar15 * 0.0;
          local_11a0._20_4_ = fVar16 * 0.0;
          local_11a0._24_4_ = fVar17 * 0.0;
          local_11a0._28_4_ = 0;
          auVar48._8_4_ = 0x7f800000;
          auVar48._0_8_ = 0x7f8000007f800000;
          auVar48._12_4_ = 0x7f800000;
          auVar48._16_4_ = 0x7f800000;
          auVar48._20_4_ = 0x7f800000;
          auVar48._24_4_ = 0x7f800000;
          auVar48._28_4_ = 0x7f800000;
          auVar72 = vblendvps_avx(auVar48,local_1200,auVar72);
          auVar52 = vshufps_avx(auVar72,auVar72,0xb1);
          auVar52 = vminps_avx(auVar72,auVar52);
          auVar57 = vshufpd_avx(auVar52,auVar52,5);
          auVar52 = vminps_avx(auVar52,auVar57);
          auVar57 = vpermpd_avx2(auVar52,0x4e);
          auVar52 = vminps_avx(auVar52,auVar57);
          auVar72 = vcmpps_avx(auVar72,auVar52,0);
          auVar55 = vpackssdw_avx(auVar72._0_16_,auVar72._16_16_);
          auVar51 = vpand_avx(auVar55,auVar51);
          auVar72 = vpmovzxwd_avx2(auVar51);
          auVar72 = vpslld_avx2(auVar72,0x1f);
          if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar72 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar72 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar72 >> 0x7f,0) == '\0') &&
                (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar72 >> 0xbf,0) == '\0') &&
              (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar72[0x1f]) {
            auVar72 = local_1440;
          }
          uVar35 = vmovmskps_avx(auVar72);
          uVar38 = 0;
          for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x80000000) {
            uVar38 = uVar38 + 1;
          }
          do {
            uVar39 = (ulong)uVar38;
            uVar38 = *(uint *)((long)&local_10e0 + uVar39 * 4);
            pGVar11 = (pSVar5->geometries).items[uVar38].ptr;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              *(undefined4 *)(local_1440 + uVar39 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar93 = *(undefined4 *)(local_1240 + uVar39 * 4);
                uVar4 = *(undefined4 *)(local_1220 + uVar39 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1200 + uVar39 * 4);
                *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_11e0 + uVar39 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_11c0 + uVar39 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_11a0 + uVar39 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar93;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x220) =
                     *(undefined4 *)((long)&local_1360 + uVar39 * 4);
                *(uint *)(ray + k * 4 + 0x240) = uVar38;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                break;
              }
              local_1160 = auVar73._0_32_;
              local_1420 = auVar50._0_32_;
              uVar93 = *(undefined4 *)(local_1240 + uVar39 * 4);
              local_1060._4_4_ = uVar93;
              local_1060._0_4_ = uVar93;
              local_1060._8_4_ = uVar93;
              local_1060._12_4_ = uVar93;
              local_1060._16_4_ = uVar93;
              local_1060._20_4_ = uVar93;
              local_1060._24_4_ = uVar93;
              local_1060._28_4_ = uVar93;
              local_1040 = *(undefined4 *)(local_1220 + uVar39 * 4);
              uVar93 = *(undefined4 *)((long)&local_1360 + uVar39 * 4);
              auVar62._4_4_ = uVar93;
              auVar62._0_4_ = uVar93;
              auVar62._8_4_ = uVar93;
              auVar62._12_4_ = uVar93;
              auVar66._16_4_ = uVar93;
              auVar66._0_16_ = auVar62;
              auVar66._20_4_ = uVar93;
              auVar66._24_4_ = uVar93;
              auVar66._28_4_ = uVar93;
              uVar93 = *(undefined4 *)(local_11e0 + uVar39 * 4);
              uVar4 = *(undefined4 *)(local_11c0 + uVar39 * 4);
              local_10a0._4_4_ = uVar4;
              local_10a0._0_4_ = uVar4;
              local_10a0._8_4_ = uVar4;
              local_10a0._12_4_ = uVar4;
              local_10a0._16_4_ = uVar4;
              local_10a0._20_4_ = uVar4;
              local_10a0._24_4_ = uVar4;
              local_10a0._28_4_ = uVar4;
              uVar4 = *(undefined4 *)(local_11a0 + uVar39 * 4);
              local_1080._4_4_ = uVar4;
              local_1080._0_4_ = uVar4;
              local_1080._8_4_ = uVar4;
              local_1080._12_4_ = uVar4;
              local_1080._16_4_ = uVar4;
              local_1080._20_4_ = uVar4;
              local_1080._24_4_ = uVar4;
              local_1080._28_4_ = uVar4;
              auVar56._4_4_ = uVar38;
              auVar56._0_4_ = uVar38;
              auVar56._8_4_ = uVar38;
              auVar56._12_4_ = uVar38;
              auVar60._16_4_ = uVar38;
              auVar60._0_16_ = auVar56;
              auVar60._20_4_ = uVar38;
              auVar60._24_4_ = uVar38;
              auVar60._28_4_ = uVar38;
              local_10c0[0] = (RTCHitN)(char)uVar93;
              local_10c0[1] = (RTCHitN)(char)((uint)uVar93 >> 8);
              local_10c0[2] = (RTCHitN)(char)((uint)uVar93 >> 0x10);
              local_10c0[3] = (RTCHitN)(char)((uint)uVar93 >> 0x18);
              local_10c0[4] = (RTCHitN)(char)uVar93;
              local_10c0[5] = (RTCHitN)(char)((uint)uVar93 >> 8);
              local_10c0[6] = (RTCHitN)(char)((uint)uVar93 >> 0x10);
              local_10c0[7] = (RTCHitN)(char)((uint)uVar93 >> 0x18);
              local_10c0[8] = (RTCHitN)(char)uVar93;
              local_10c0[9] = (RTCHitN)(char)((uint)uVar93 >> 8);
              local_10c0[10] = (RTCHitN)(char)((uint)uVar93 >> 0x10);
              local_10c0[0xb] = (RTCHitN)(char)((uint)uVar93 >> 0x18);
              local_10c0[0xc] = (RTCHitN)(char)uVar93;
              local_10c0[0xd] = (RTCHitN)(char)((uint)uVar93 >> 8);
              local_10c0[0xe] = (RTCHitN)(char)((uint)uVar93 >> 0x10);
              local_10c0[0xf] = (RTCHitN)(char)((uint)uVar93 >> 0x18);
              local_10c0[0x10] = (RTCHitN)(char)uVar93;
              local_10c0[0x11] = (RTCHitN)(char)((uint)uVar93 >> 8);
              local_10c0[0x12] = (RTCHitN)(char)((uint)uVar93 >> 0x10);
              local_10c0[0x13] = (RTCHitN)(char)((uint)uVar93 >> 0x18);
              local_10c0[0x14] = (RTCHitN)(char)uVar93;
              local_10c0[0x15] = (RTCHitN)(char)((uint)uVar93 >> 8);
              local_10c0[0x16] = (RTCHitN)(char)((uint)uVar93 >> 0x10);
              local_10c0[0x17] = (RTCHitN)(char)((uint)uVar93 >> 0x18);
              local_10c0[0x18] = (RTCHitN)(char)uVar93;
              local_10c0[0x19] = (RTCHitN)(char)((uint)uVar93 >> 8);
              local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar93 >> 0x10);
              local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar93 >> 0x18);
              local_10c0[0x1c] = (RTCHitN)(char)uVar93;
              local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar93 >> 8);
              local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar93 >> 0x10);
              local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar93 >> 0x18);
              uStack_103c = local_1040;
              uStack_1038 = local_1040;
              uStack_1034 = local_1040;
              uStack_1030 = local_1040;
              uStack_102c = local_1040;
              uStack_1028 = local_1040;
              uStack_1024 = local_1040;
              local_1020 = auVar66;
              local_1000 = auVar60;
              vpcmpeqd_avx2(local_1060,local_1060);
              uStack_fdc = context->user->instID[0];
              local_fe0 = uStack_fdc;
              uStack_fd8 = uStack_fdc;
              uStack_fd4 = uStack_fdc;
              uStack_fd0 = uStack_fdc;
              uStack_fcc = uStack_fdc;
              uStack_fc8 = uStack_fdc;
              uStack_fc4 = uStack_fdc;
              uStack_fbc = context->user->instPrimID[0];
              local_fc0 = uStack_fbc;
              uStack_fb8 = uStack_fbc;
              uStack_fb4 = uStack_fbc;
              uStack_fb0 = uStack_fbc;
              uStack_fac = uStack_fbc;
              uStack_fa8 = uStack_fbc;
              uStack_fa4 = uStack_fbc;
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1200 + uVar39 * 4);
              local_1400 = local_1140;
              local_1470.valid = (int *)local_1400;
              local_1470.geometryUserPtr = pGVar11->userPtr;
              local_1470.context = context->user;
              local_1470.hit = local_10c0;
              local_1470.N = 8;
              local_1470.ray = (RTCRayN *)ray;
              if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar60 = ZEXT1632(auVar56);
                auVar66 = ZEXT1632(auVar62);
                (*pGVar11->intersectionFilterN)(&local_1470);
              }
              auVar52 = vpcmpeqd_avx2(local_1400,_DAT_01f7b000);
              auVar72 = _DAT_01f7b020 & ~auVar52;
              if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar72 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar72 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar72 >> 0x7f,0) == '\0') &&
                    (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar72 >> 0xbf,0) == '\0') &&
                  (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar72[0x1f]) {
                auVar52 = auVar52 ^ _DAT_01f7b020;
              }
              else {
                p_Var12 = context->args->filter;
                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar60 = ZEXT1632(auVar60._0_16_);
                  auVar66 = ZEXT1632(auVar66._0_16_);
                  (*p_Var12)(&local_1470);
                }
                auVar57 = vpcmpeqd_avx2(local_1400,_DAT_01f7b000);
                auVar72 = vpcmpeqd_avx2(auVar66,auVar66);
                auVar52 = auVar57 ^ auVar72;
                auVar53 = vpcmpeqd_avx2(auVar60,auVar60);
                auVar72 = auVar72 & ~auVar57;
                if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar72 >> 0x7f,0) != '\0') ||
                      (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar72 >> 0xbf,0) != '\0') ||
                    (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar72[0x1f] < '\0') {
                  auVar57 = auVar57 ^ auVar53;
                  auVar72 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])local_1470.hit);
                  *(undefined1 (*) [32])(local_1470.ray + 0x180) = auVar72;
                  auVar72 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])(local_1470.hit + 0x20));
                  *(undefined1 (*) [32])(local_1470.ray + 0x1a0) = auVar72;
                  auVar72 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])(local_1470.hit + 0x40));
                  *(undefined1 (*) [32])(local_1470.ray + 0x1c0) = auVar72;
                  auVar72 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])(local_1470.hit + 0x60));
                  *(undefined1 (*) [32])(local_1470.ray + 0x1e0) = auVar72;
                  auVar72 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])(local_1470.hit + 0x80));
                  *(undefined1 (*) [32])(local_1470.ray + 0x200) = auVar72;
                  auVar72 = vpmaskmovd_avx2(auVar57,*(undefined1 (*) [32])(local_1470.hit + 0xa0));
                  *(undefined1 (*) [32])(local_1470.ray + 0x220) = auVar72;
                  auVar72 = vpmaskmovd_avx2(auVar57,*(undefined1 (*) [32])(local_1470.hit + 0xc0));
                  *(undefined1 (*) [32])(local_1470.ray + 0x240) = auVar72;
                  auVar72 = vpmaskmovd_avx2(auVar57,*(undefined1 (*) [32])(local_1470.hit + 0xe0));
                  *(undefined1 (*) [32])(local_1470.ray + 0x260) = auVar72;
                  auVar72 = vpmaskmovd_avx2(auVar57,*(undefined1 (*) [32])(local_1470.hit + 0x100));
                  *(undefined1 (*) [32])(local_1470.ray + 0x280) = auVar72;
                }
              }
              if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar52 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar52 >> 0x7f,0) == '\0') &&
                    (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar52 >> 0xbf,0) == '\0') &&
                  (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar52[0x1f]) {
                *(undefined4 *)(ray + k * 4 + 0x100) = local_1420._0_4_;
              }
              else {
                local_1420 = ZEXT432(*(uint *)(ray + k * 4 + 0x100));
              }
              *(undefined4 *)(local_1440 + uVar39 * 4) = 0;
              auVar50 = ZEXT3264(local_1420);
              uVar93 = local_1420._0_4_;
              auVar49._4_4_ = uVar93;
              auVar49._0_4_ = uVar93;
              auVar49._8_4_ = uVar93;
              auVar49._12_4_ = uVar93;
              auVar49._16_4_ = uVar93;
              auVar49._20_4_ = uVar93;
              auVar49._24_4_ = uVar93;
              auVar49._28_4_ = uVar93;
              auVar73 = ZEXT3264(local_1160);
              auVar72 = vcmpps_avx(local_1160,auVar49,2);
              local_1440 = vandps_avx(auVar72,local_1440);
            }
            if ((((((((local_1440 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_1440 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1440 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_1440 >> 0x7f,0) == '\0') &&
                  (local_1440 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_1440 >> 0xbf,0) == '\0') &&
                (local_1440 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_1440[0x1f]) break;
            auVar54._8_4_ = 0x7f800000;
            auVar54._0_8_ = 0x7f8000007f800000;
            auVar54._12_4_ = 0x7f800000;
            auVar54._16_4_ = 0x7f800000;
            auVar54._20_4_ = 0x7f800000;
            auVar54._24_4_ = 0x7f800000;
            auVar54._28_4_ = 0x7f800000;
            auVar72 = vblendvps_avx(auVar54,auVar73._0_32_,local_1440);
            auVar52 = vshufps_avx(auVar72,auVar72,0xb1);
            auVar52 = vminps_avx(auVar72,auVar52);
            auVar57 = vshufpd_avx(auVar52,auVar52,5);
            auVar52 = vminps_avx(auVar52,auVar57);
            auVar57 = vpermpd_avx2(auVar52,0x4e);
            auVar52 = vminps_avx(auVar52,auVar57);
            auVar52 = vcmpps_avx(auVar72,auVar52,0);
            auVar57 = local_1440 & auVar52;
            auVar72 = local_1440;
            if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar57 >> 0x7f,0) != '\0') ||
                  (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar57 >> 0xbf,0) != '\0') ||
                (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar57[0x1f] < '\0') {
              auVar72 = vandps_avx(auVar52,local_1440);
            }
            uVar35 = vmovmskps_avx(auVar72);
            uVar38 = 0;
            for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x80000000) {
              uVar38 = uVar38 + 1;
            }
          } while( true );
        }
      }
      auVar73 = ZEXT1664(local_1370);
      auVar76 = ZEXT1664(local_1380);
      auVar82 = ZEXT1664(local_1390);
      auVar87 = ZEXT1664(local_13a0);
      auVar89 = ZEXT1664(local_13b0);
      auVar92 = ZEXT1664(local_13c0);
      auVar95 = ZEXT1664(local_13d0);
    }
    uVar93 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar50 = ZEXT1664(CONCAT412(uVar93,CONCAT48(uVar93,CONCAT44(uVar93,uVar93))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }